

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O3

int pcap_offline_read(pcap_t *p,int cnt,pcap_handler callback,u_char *user)

{
  bpf_insn *pc;
  int iVar1;
  u_int uVar2;
  int iVar3;
  u_char *data;
  pcap_pkthdr h;
  u_char *local_50;
  pcap_pkthdr local_48;
  
  if (p->break_loop == 0) {
    iVar3 = 0;
    do {
      iVar1 = (*p->next_packet_op)(p,&local_48,&local_50);
      if (iVar1 != 0) {
        if (iVar1 != 1) {
          return iVar1;
        }
        return 0;
      }
      pc = (p->fcode).bf_insns;
      if ((pc == (bpf_insn *)0x0) ||
         (uVar2 = bpf_filter(pc,local_50,local_48.len,local_48.caplen), uVar2 != 0)) {
        (*callback)(user,&local_48,local_50);
        iVar3 = iVar3 + 1;
        if (0 < cnt && cnt <= iVar3) {
          return iVar3;
        }
      }
    } while (p->break_loop == 0);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  p->break_loop = 0;
  return -2;
}

Assistant:

int
pcap_offline_read(pcap_t *p, int cnt, pcap_handler callback, u_char *user)
{
	struct bpf_insn *fcode;
	int status = 0;
	int n = 0;
	u_char *data;

	while (status == 0) {
		struct pcap_pkthdr h;

		/*
		 * Has "pcap_breakloop()" been called?
		 * If so, return immediately - if we haven't read any
		 * packets, clear the flag and return -2 to indicate
		 * that we were told to break out of the loop, otherwise
		 * leave the flag set, so that the *next* call will break
		 * out of the loop without having read any packets, and
		 * return the number of packets we've processed so far.
		 */
		if (p->break_loop) {
			if (n == 0) {
				p->break_loop = 0;
				return (-2);
			} else
				return (n);
		}

		status = p->next_packet_op(p, &h, &data);
		if (status) {
			if (status == 1)
				return (0);
			return (status);
		}

		if ((fcode = p->fcode.bf_insns) == NULL ||
		    bpf_filter(fcode, data, h.len, h.caplen)) {
			(*callback)(user, &h, data);
			if (++n >= cnt && cnt > 0)
				break;
		}
	}
	/*XXX this breaks semantics tcpslice expects */
	return (n);
}